

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O2

void pnga_access_ghost_element(Integer g_a,AccessIndex *index,Integer *subscript,Integer *ld)

{
  long icode;
  ushort uVar1;
  int iVar2;
  C_Integer *pCVar3;
  global_array_t *pgVar4;
  Integer IVar5;
  Integer IVar6;
  long lVar7;
  SingleComplex **ppSVar8;
  ushort uVar9;
  long lVar10;
  long lVar11;
  C_Integer CVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  DoubleComplex *pDVar17;
  char *pcVar18;
  long lVar19;
  ulong uVar20;
  int _index [7];
  Integer _hi [7];
  Integer _lo [7];
  Integer tmp_sub [7];
  
  icode = g_a + 1000;
  lVar19 = 0;
  IVar5 = pnga_nodeid();
  pgVar4 = GA;
  uVar1 = GA[icode].ndim;
  lVar16 = (long)(short)uVar1;
  lVar7 = 0;
  if (0 < lVar16) {
    lVar7 = lVar16;
  }
  for (; lVar7 != lVar19; lVar19 = lVar19 + 1) {
    tmp_sub[lVar19] = subscript[lVar19] + -1;
  }
  lVar19 = lVar16 + -1;
  iVar14 = GA[icode].distr_type;
  if (iVar14 - 1U < 3) {
    lVar11 = (long)(int)IVar5 % GA[icode].num_blocks[0];
    _index[0] = (int)lVar11;
    lVar7 = 0;
    IVar6 = IVar5;
    while (lVar7 + 1 < lVar16) {
      IVar6 = (long)((int)IVar6 - (int)lVar11) / GA[g_a + 1000].num_blocks[lVar7];
      lVar11 = (long)(int)IVar6 % GA[g_a + 1000].num_blocks[lVar7 + 1];
      _index[lVar7 + 1] = (int)lVar11;
      lVar7 = lVar7 + 1;
    }
    lVar7 = 0;
    uVar9 = 0;
    if (0 < (short)uVar1) {
      uVar9 = uVar1;
    }
    for (; (ulong)uVar9 * 4 != lVar7; lVar7 = lVar7 + 4) {
      iVar14 = *(int *)((long)_index + lVar7);
      lVar11 = *(long *)((long)GA[g_a + 1000].block_dims + lVar7 * 2);
      *(long *)((long)_lo + lVar7 * 2) = lVar11 * iVar14 + 1;
      lVar11 = ((long)iVar14 + 1) * lVar11;
      lVar15 = *(long *)((long)GA[g_a + 1000].dims + lVar7 * 2);
      if (lVar15 <= lVar11) {
        lVar11 = lVar15;
      }
      *(long *)((long)_hi + lVar7 * 2) = lVar11;
    }
  }
  else if (iVar14 == 4) {
    lVar11 = (long)(int)IVar5 % GA[icode].num_blocks[0];
    _index[0] = (int)lVar11;
    IVar6 = IVar5;
    lVar7 = 0;
    while (lVar7 + 1 < lVar16) {
      IVar6 = (long)((int)IVar6 - (int)lVar11) / GA[g_a + 1000].num_blocks[lVar7];
      lVar11 = (long)(int)IVar6 % GA[g_a + 1000].num_blocks[lVar7 + 1];
      _index[lVar7 + 1] = (int)lVar11;
      lVar7 = lVar7 + 1;
    }
    lVar7 = 0;
    uVar9 = 0;
    if (0 < (short)uVar1) {
      uVar9 = uVar1;
    }
    iVar14 = 0;
    for (; (ulong)uVar9 * 4 != lVar7; lVar7 = lVar7 + 4) {
      pCVar3 = GA[icode].mapc;
      iVar2 = *(int *)((long)_index + lVar7);
      lVar15 = (long)iVar14 + (long)iVar2;
      *(C_Integer *)((long)_lo + lVar7 * 2) = pCVar3[lVar15];
      lVar11 = *(long *)((long)GA[icode].num_blocks + lVar7 * 2);
      if ((long)iVar2 < lVar11 + -1) {
        lVar15 = pCVar3[lVar15 + 1] + -1;
      }
      else {
        lVar15 = *(long *)((long)GA[icode].dims + lVar7 * 2);
      }
      *(long *)((long)_hi + lVar7 * 2) = lVar15;
      iVar14 = iVar14 + (int)lVar11;
    }
  }
  else if (iVar14 == 0) {
    if (GA[icode].num_rstrctd == 0) {
      lVar11 = 1;
      for (lVar15 = 0; lVar7 != lVar15; lVar15 = lVar15 + 1) {
        lVar11 = lVar11 * GA[g_a + 1000].nblock[lVar15];
      }
      if ((IVar5 < 0) || (lVar11 <= IVar5)) {
        for (lVar11 = 0; lVar7 != lVar11; lVar11 = lVar11 + 1) {
          _lo[lVar11] = 0;
          _hi[lVar11] = -1;
        }
      }
      else {
        lVar15 = 0;
        IVar6 = IVar5;
        for (lVar11 = 0; lVar7 != lVar11; lVar11 = lVar11 + 1) {
          lVar13 = (long)GA[g_a + 1000].nblock[lVar11];
          lVar10 = IVar6 % lVar13;
          pCVar3 = GA[icode].mapc;
          _lo[lVar11] = pCVar3[lVar10 + lVar15];
          if (lVar10 == lVar13 + -1) {
            CVar12 = GA[g_a + 1000].dims[lVar11];
          }
          else {
            CVar12 = pCVar3[lVar10 + lVar15 + 1] + -1;
          }
          lVar15 = lVar15 + lVar13;
          _hi[lVar11] = CVar12;
          IVar6 = IVar6 / lVar13;
        }
      }
    }
    else if (IVar5 < GA[icode].num_rstrctd) {
      lVar11 = 1;
      for (lVar15 = 0; lVar7 != lVar15; lVar15 = lVar15 + 1) {
        lVar11 = lVar11 * GA[g_a + 1000].nblock[lVar15];
      }
      if ((IVar5 < 0) || (lVar11 <= IVar5)) {
        for (lVar11 = 0; lVar7 != lVar11; lVar11 = lVar11 + 1) {
          _lo[lVar11] = 0;
          _hi[lVar11] = -1;
        }
      }
      else {
        lVar15 = 0;
        IVar6 = IVar5;
        for (lVar11 = 0; lVar7 != lVar11; lVar11 = lVar11 + 1) {
          lVar13 = (long)GA[g_a + 1000].nblock[lVar11];
          lVar10 = IVar6 % lVar13;
          pCVar3 = GA[icode].mapc;
          _lo[lVar11] = pCVar3[lVar10 + lVar15];
          if (lVar10 == lVar13 + -1) {
            CVar12 = GA[g_a + 1000].dims[lVar11];
          }
          else {
            CVar12 = pCVar3[lVar10 + lVar15 + 1] + -1;
          }
          lVar15 = lVar15 + lVar13;
          _hi[lVar11] = CVar12;
          IVar6 = IVar6 / lVar13;
        }
      }
    }
    else {
      lVar7 = 0;
      iVar14 = 0;
      if (0 < (short)uVar1) {
        iVar14 = (int)(short)uVar1;
      }
      for (; iVar14 != lVar7; lVar7 = lVar7 + 1) {
        _lo[lVar7] = 0;
        _hi[lVar7] = -1;
      }
    }
  }
  if (lVar19 == 0) {
    *ld = (_hi[0] - _lo[0]) + GA[icode].width[0] * 2 + 1;
  }
  lVar7 = 0;
  if (lVar19 < 1) {
    lVar19 = lVar7;
  }
  lVar11 = 1;
  for (lVar15 = 0; lVar19 != lVar15; lVar15 = lVar15 + 1) {
    lVar7 = lVar7 + tmp_sub[lVar15] * lVar11;
    lVar10 = (_hi[lVar15] - _lo[lVar15]) + pgVar4[g_a + 1000].width[lVar15] * 2 + 1;
    ld[lVar15] = lVar10;
    lVar11 = lVar11 * lVar10;
  }
  uVar20 = (ulong)pgVar4[icode].elemsize;
  pcVar18 = pgVar4[icode].ptr[IVar5] + (lVar11 * tmp_sub[lVar16 + -1] + lVar7) * uVar20;
  IVar5 = pnga_type_c2f((long)pgVar4[icode].type);
  switch(IVar5) {
  case 0x3f2:
    ppSVar8 = (SingleComplex **)&INT_MB;
    break;
  default:
    pDVar17 = (DoubleComplex *)0x0;
    goto LAB_0017547e;
  case 0x3f4:
    lVar7 = (long)pcVar18 - (long)FLT_MB >> 2;
    pDVar17 = (DoubleComplex *)FLT_MB;
    goto LAB_0017547b;
  case 0x3f5:
    ppSVar8 = (SingleComplex **)&DBL_MB;
    break;
  case 0x3f6:
    ppSVar8 = &SCPL_MB;
    break;
  case 0x3f7:
    lVar7 = (long)pcVar18 - (long)DCPL_MB >> 4;
    pDVar17 = DCPL_MB;
    goto LAB_0017547b;
  }
  pDVar17 = (DoubleComplex *)*ppSVar8;
  lVar7 = (long)pcVar18 - (long)pDVar17 >> 3;
LAB_0017547b:
  *index = lVar7;
LAB_0017547e:
  if ((ulong)pcVar18 % uVar20 != (ulong)pDVar17 % uVar20) {
    printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(ulong)(uint)GAme,pcVar18,(ulong)pcVar18 % uVar20,
           pDVar17,(ulong)pDVar17 % uVar20);
    pnga_error("nga_access: MA addressing problem: base address misallignment",icode);
  }
  *index = *index + 1;
  return;
}

Assistant:

void pnga_access_ghost_element(Integer g_a, AccessIndex* index,
                        Integer subscript[], Integer ld[])
{
char *ptr=NULL;
Integer  handle = GA_OFFSET + g_a;
Integer i=0;
Integer tmp_sub[MAXDIM];
unsigned long    elemsize=0;
unsigned long    lref=0, lptr=0;
Integer me = pnga_nodeid();
   /* Indices conform to Fortran convention. Shift them down 1 so that
      gam_LocationWithGhosts works. */
   for (i=0; i<GA[handle].ndim; i++) tmp_sub[i] = subscript[i] - 1;
   gam_LocationWithGhosts(me, handle, tmp_sub, &ptr, ld);
   /*
    * return patch address as the distance elements from the reference address
    *
    * .in Fortran we need only the index to the type array: dbl_mb or int_mb
    *  that are elements of COMMON in the the mafdecls.h include file
    * .in C we need both the index and the pointer
    */

   elemsize = (unsigned long)GA[handle].elemsize;

   /* compute index and check if it is correct */
   switch (pnga_type_c2f(GA[handle].type)){
     case MT_F_DBL:
        *index = (AccessIndex) ((DoublePrecision*)ptr - DBL_MB);
        lref = (unsigned long)DBL_MB;
        break;

     case MT_F_DCPL:
        *index = (AccessIndex) ((DoubleComplex*)ptr - DCPL_MB);
        lref = (unsigned long)DCPL_MB;
        break;

     case MT_F_SCPL:
        *index = (AccessIndex) ((SingleComplex*)ptr - SCPL_MB);
        lref = (unsigned long)SCPL_MB;
        break;

     case MT_F_INT:
        *index = (AccessIndex) ((Integer*)ptr - INT_MB);
        lref = (unsigned long)INT_MB;
        break;

     case MT_F_REAL:
        *index = (AccessIndex) ((float*)ptr - FLT_MB);
        lref = (unsigned long)FLT_MB;
        break;        
   }

   /* check the allignment */
   lptr = (unsigned long)ptr;
   if( lptr%elemsize != lref%elemsize ){ 
       printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(int)GAme,lptr,lptr%elemsize,
                                                    lref,lref%elemsize);
       pnga_error("nga_access: MA addressing problem: base address misallignment",
                 handle);
   }

   /* adjust index for Fortran addressing */
   (*index) ++ ;

   FLUSH_CACHE;
}